

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack4to16.h
# Opt level: O2

void ncnn::im2col_sgemm_pack4to16_avx512
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined4 uVar1;
  undefined1 auVar2 [64];
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  uint _c;
  int *piVar29;
  _func_int ***ppp_Var30;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  undefined1 (*pauVar34) [64];
  int iVar35;
  long lVar36;
  undefined1 (*pauVar37) [64];
  int iVar38;
  uint uVar39;
  ulong uVar40;
  undefined1 (*pauVar41) [64];
  int q;
  ulong uVar42;
  undefined1 (*pauVar43) [16];
  long lVar44;
  int iVar45;
  ulong uVar47;
  bool bVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 local_d8 [64];
  size_t local_98;
  ulong local_88;
  void *local_80;
  float zeros [16];
  ulong uVar46;
  
  uVar3 = bottom_im2col->w;
  uVar47 = (ulong)(int)uVar3;
  iVar45 = bottom_im2col->h;
  uVar39 = bottom_im2col->c;
  local_88 = (ulong)(uint)top_blob->c;
  local_80 = _bias->data;
  local_98 = 0;
  local_d8._0_8_ = (Allocator *)0x0;
  local_d8._8_4_ = 0;
  local_d8._12_4_ = 0;
  local_d8._16_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_d8._24_4_ = 0;
  iVar35 = iVar45 << 4;
  if ((long)uVar47 < 0x10) {
    iVar35 = iVar45;
  }
  local_d8._48_12_ = SUB1612(ZEXT816(0) << 0x40,4);
  _c = (uVar3 & 0xf) + (uVar3 >> 4);
  if ((long)uVar47 < 0x10) {
    _c = uVar3;
  }
  local_d8._32_8_ = local_d8._0_8_;
  local_d8._40_4_ = local_d8._8_4_;
  local_d8._44_4_ = local_d8._12_4_;
  Mat::create((Mat *)local_d8,iVar35,uVar39,_c,0x10,4,opt->workspace_allocator);
  uVar31 = 0;
  iVar35 = 0;
  if (0 < iVar45) {
    iVar35 = iVar45;
  }
  uVar40 = 0;
  if (0 < (int)uVar39) {
    uVar40 = (ulong)uVar39;
  }
  uVar33 = (ulong)(uint)((int)uVar3 >> 4);
  if ((int)uVar3 >> 4 < 1) {
    uVar33 = uVar31;
  }
  lVar36 = (long)(int)(uVar3 * 4) * 4;
  lVar32 = 0x80;
  for (; uVar31 != uVar33; uVar31 = uVar31 + 1) {
    ppp_Var30 = (_func_int ***)
                ((long)(_func_int ***)local_d8._0_8_ + local_98 * uVar31 * local_d8._16_8_);
    for (uVar42 = 0; uVar42 != uVar40; uVar42 = uVar42 + 1) {
      pauVar43 = (undefined1 (*) [16])
                 ((long)bottom_im2col->data +
                 bottom_im2col->cstep * bottom_im2col->elemsize * uVar42 + lVar32);
      iVar38 = iVar35;
      while (bVar48 = iVar38 != 0, iVar38 = iVar38 + -1, bVar48) {
        auVar49 = vunpcklps_avx512vl(pauVar43[-8],pauVar43[-7]);
        auVar50 = vunpcklps_avx512vl(pauVar43[-6],pauVar43[-5]);
        auVar4 = vunpckhps_avx(pauVar43[-8],pauVar43[-7]);
        auVar5 = vunpckhps_avx(pauVar43[-6],pauVar43[-5]);
        auVar8 = vmovlhps_avx512f(auVar49,auVar50);
        auVar51 = vunpckhpd_avx512vl(auVar49,auVar50);
        auVar9 = vmovlhps_avx512f(auVar4,auVar5);
        auVar50 = vunpckhpd_avx(auVar4,auVar5);
        auVar4 = vunpcklps_avx(pauVar43[-4],pauVar43[-3]);
        auVar52 = vunpcklps_avx512vl(pauVar43[-2],pauVar43[-1]);
        auVar5 = vunpckhps_avx(pauVar43[-4],pauVar43[-3]);
        auVar49 = vunpckhps_avx(pauVar43[-2],pauVar43[-1]);
        auVar10 = vmovlhps_avx512f(auVar4,auVar52);
        auVar53 = vunpckhpd_avx512vl(auVar4,auVar52);
        auVar4 = vmovlhps_avx(auVar5,auVar49);
        auVar52 = vunpckhpd_avx(auVar5,auVar49);
        auVar5 = vunpcklps_avx(*pauVar43,pauVar43[1]);
        auVar54 = vunpcklps_avx512vl(pauVar43[2],pauVar43[3]);
        auVar49 = vunpckhps_avx(*pauVar43,pauVar43[1]);
        auVar6 = vunpckhps_avx(pauVar43[2],pauVar43[3]);
        auVar11 = vmovlhps_avx512f(auVar5,auVar54);
        auVar55 = vunpckhpd_avx512vl(auVar5,auVar54);
        auVar5 = vmovlhps_avx(auVar49,auVar6);
        auVar6 = vunpckhpd_avx(auVar49,auVar6);
        auVar49 = vunpcklps_avx(pauVar43[4],pauVar43[5]);
        auVar56 = vunpcklps_avx512vl(pauVar43[6],pauVar43[7]);
        auVar54 = vunpckhps_avx(pauVar43[4],pauVar43[5]);
        auVar7 = vunpckhps_avx(pauVar43[6],pauVar43[7]);
        auVar12 = vmovlhps_avx512f(auVar49,auVar56);
        auVar56 = vunpckhpd_avx512vl(auVar49,auVar56);
        auVar49 = vmovlhps_avx(auVar54,auVar7);
        auVar54 = vunpckhpd_avx(auVar54,auVar7);
        *(undefined1 (*) [16])ppp_Var30 = auVar8;
        *(undefined1 (*) [16])(ppp_Var30 + 2) = auVar10;
        *(undefined1 (*) [16])(ppp_Var30 + 4) = auVar11;
        *(undefined1 (*) [16])(ppp_Var30 + 6) = auVar12;
        *(undefined1 (*) [16])(ppp_Var30 + 8) = auVar51;
        *(undefined1 (*) [16])(ppp_Var30 + 10) = auVar53;
        *(undefined1 (*) [16])(ppp_Var30 + 0xc) = auVar55;
        *(undefined1 (*) [16])(ppp_Var30 + 0xe) = auVar56;
        *(undefined1 (*) [16])(ppp_Var30 + 0x10) = auVar9;
        *(undefined1 (*) [16])(ppp_Var30 + 0x12) = auVar4;
        *(undefined1 (*) [16])(ppp_Var30 + 0x14) = auVar5;
        *(undefined1 (*) [16])(ppp_Var30 + 0x16) = auVar49;
        *(undefined1 (*) [16])(ppp_Var30 + 0x18) = auVar50;
        *(undefined1 (*) [16])(ppp_Var30 + 0x1a) = auVar52;
        *(undefined1 (*) [16])(ppp_Var30 + 0x1c) = auVar6;
        *(undefined1 (*) [16])(ppp_Var30 + 0x1e) = auVar54;
        ppp_Var30 = ppp_Var30 + 0x20;
        pauVar43 = (undefined1 (*) [16])(*pauVar43 + lVar36);
      }
    }
    lVar32 = lVar32 + 0x100;
  }
  uVar31 = uVar47 & 0xfffffffffffffff0;
  lVar32 = uVar31 << 4;
  for (; (long)uVar31 < (long)uVar47; uVar31 = uVar31 + 1) {
    uVar33 = (ulong)(uint)((int)uVar31 >> 0x1f) << 0x20 | uVar31 & 0xffffffff;
    ppp_Var30 = (_func_int ***)
                ((long)(_func_int ***)local_d8._0_8_ +
                (long)((int)((long)uVar33 % 0x10) + (int)((long)uVar33 / 0x10)) * local_98 *
                local_d8._16_8_);
    for (uVar33 = 0; uVar33 != uVar40; uVar33 = uVar33 + 1) {
      pauVar43 = (undefined1 (*) [16])
                 ((long)bottom_im2col->data +
                 bottom_im2col->cstep * bottom_im2col->elemsize * uVar33 + lVar32);
      iVar38 = iVar35;
      while (bVar48 = iVar38 != 0, iVar38 = iVar38 + -1, bVar48) {
        *(undefined1 (*) [16])ppp_Var30 = *pauVar43;
        ppp_Var30 = ppp_Var30 + 2;
        pauVar43 = (undefined1 (*) [16])(*pauVar43 + lVar36);
      }
    }
    lVar32 = lVar32 + 0x10;
  }
  uVar40 = 0;
  uVar31 = (ulong)(uVar39 * iVar45 * 4);
  if ((int)(uVar39 * iVar45 * 4) < 1) {
    uVar31 = uVar40;
  }
  uVar33 = local_88 & 0xffffffff;
  if ((int)local_88 < 1) {
    uVar33 = uVar40;
  }
  for (; uVar40 != uVar33; uVar40 = uVar40 + 1) {
    pauVar34 = (undefined1 (*) [64])
               (top_blob->cstep * uVar40 * top_blob->elemsize + (long)top_blob->data);
    zeros[0] = 0.0;
    zeros[1] = 0.0;
    zeros[2] = 0.0;
    zeros[3] = 0.0;
    zeros[4] = 0.0;
    zeros[5] = 0.0;
    zeros[6] = 0.0;
    zeros[7] = 0.0;
    zeros[8] = 0.0;
    zeros[9] = 0.0;
    zeros[10] = 0.0;
    zeros[0xb] = 0.0;
    zeros[0xc] = 0.0;
    zeros[0xd] = 0.0;
    zeros[0xe] = 0.0;
    zeros[0xf] = 0.0;
    pauVar37 = (undefined1 (*) [64])(uVar40 * 0x40 + (long)local_80);
    if (local_80 == (void *)0x0) {
      pauVar37 = (undefined1 (*) [64])zeros;
    }
    lVar32 = 0;
    uVar42 = 0;
    while( true ) {
      if ((long)uVar47 <= (long)(uVar42 | 0xf)) break;
      auVar58 = *pauVar37;
      lVar36 = local_98 * local_d8._16_8_ * lVar32;
      lVar44 = 0;
      uVar46 = uVar31;
      auVar59 = auVar58;
      auVar60 = auVar58;
      auVar61 = auVar58;
      auVar62 = auVar58;
      auVar63 = auVar58;
      auVar64 = auVar58;
      auVar65 = auVar58;
      auVar66 = auVar58;
      auVar67 = auVar58;
      auVar68 = auVar58;
      auVar69 = auVar58;
      auVar70 = auVar58;
      auVar71 = auVar58;
      auVar72 = auVar58;
      auVar57 = auVar58;
      while (iVar45 = (int)uVar46, uVar46 = (ulong)(iVar45 - 1), iVar45 != 0) {
        auVar2 = *(undefined1 (*) [64])
                  ((long)kernel->data + lVar44 + kernel->cstep * uVar40 * kernel->elemsize);
        uVar1 = *(undefined4 *)((long)(_func_int ***)local_d8._0_8_ + lVar44 + lVar36);
        auVar13._4_4_ = uVar1;
        auVar13._0_4_ = uVar1;
        auVar13._8_4_ = uVar1;
        auVar13._12_4_ = uVar1;
        auVar13._16_4_ = uVar1;
        auVar13._20_4_ = uVar1;
        auVar13._24_4_ = uVar1;
        auVar13._28_4_ = uVar1;
        auVar13._32_4_ = uVar1;
        auVar13._36_4_ = uVar1;
        auVar13._40_4_ = uVar1;
        auVar13._44_4_ = uVar1;
        auVar13._48_4_ = uVar1;
        auVar13._52_4_ = uVar1;
        auVar13._56_4_ = uVar1;
        auVar13._60_4_ = uVar1;
        auVar57 = vfmadd231ps_avx512f(auVar57,auVar2,auVar13);
        uVar1 = *(undefined4 *)((long)(_func_int ***)local_d8._0_8_ + lVar44 + lVar36 + 4);
        auVar14._4_4_ = uVar1;
        auVar14._0_4_ = uVar1;
        auVar14._8_4_ = uVar1;
        auVar14._12_4_ = uVar1;
        auVar14._16_4_ = uVar1;
        auVar14._20_4_ = uVar1;
        auVar14._24_4_ = uVar1;
        auVar14._28_4_ = uVar1;
        auVar14._32_4_ = uVar1;
        auVar14._36_4_ = uVar1;
        auVar14._40_4_ = uVar1;
        auVar14._44_4_ = uVar1;
        auVar14._48_4_ = uVar1;
        auVar14._52_4_ = uVar1;
        auVar14._56_4_ = uVar1;
        auVar14._60_4_ = uVar1;
        auVar58 = vfmadd231ps_avx512f(auVar58,auVar2,auVar14);
        uVar1 = *(undefined4 *)
                 ((long)&((Allocator *)(local_d8._0_8_ + 8))->_vptr_Allocator + lVar44 + lVar36);
        auVar15._4_4_ = uVar1;
        auVar15._0_4_ = uVar1;
        auVar15._8_4_ = uVar1;
        auVar15._12_4_ = uVar1;
        auVar15._16_4_ = uVar1;
        auVar15._20_4_ = uVar1;
        auVar15._24_4_ = uVar1;
        auVar15._28_4_ = uVar1;
        auVar15._32_4_ = uVar1;
        auVar15._36_4_ = uVar1;
        auVar15._40_4_ = uVar1;
        auVar15._44_4_ = uVar1;
        auVar15._48_4_ = uVar1;
        auVar15._52_4_ = uVar1;
        auVar15._56_4_ = uVar1;
        auVar15._60_4_ = uVar1;
        auVar59 = vfmadd231ps_avx512f(auVar59,auVar2,auVar15);
        uVar1 = *(undefined4 *)
                 ((long)&((Allocator *)(local_d8._0_8_ + 8))->_vptr_Allocator + lVar44 + lVar36 + 4)
        ;
        auVar16._4_4_ = uVar1;
        auVar16._0_4_ = uVar1;
        auVar16._8_4_ = uVar1;
        auVar16._12_4_ = uVar1;
        auVar16._16_4_ = uVar1;
        auVar16._20_4_ = uVar1;
        auVar16._24_4_ = uVar1;
        auVar16._28_4_ = uVar1;
        auVar16._32_4_ = uVar1;
        auVar16._36_4_ = uVar1;
        auVar16._40_4_ = uVar1;
        auVar16._44_4_ = uVar1;
        auVar16._48_4_ = uVar1;
        auVar16._52_4_ = uVar1;
        auVar16._56_4_ = uVar1;
        auVar16._60_4_ = uVar1;
        auVar60 = vfmadd231ps_avx512f(auVar60,auVar2,auVar16);
        uVar1 = *(undefined4 *)
                 ((long)&((Allocator *)(local_d8._0_8_ + 0x10))->_vptr_Allocator + lVar44 + lVar36);
        auVar17._4_4_ = uVar1;
        auVar17._0_4_ = uVar1;
        auVar17._8_4_ = uVar1;
        auVar17._12_4_ = uVar1;
        auVar17._16_4_ = uVar1;
        auVar17._20_4_ = uVar1;
        auVar17._24_4_ = uVar1;
        auVar17._28_4_ = uVar1;
        auVar17._32_4_ = uVar1;
        auVar17._36_4_ = uVar1;
        auVar17._40_4_ = uVar1;
        auVar17._44_4_ = uVar1;
        auVar17._48_4_ = uVar1;
        auVar17._52_4_ = uVar1;
        auVar17._56_4_ = uVar1;
        auVar17._60_4_ = uVar1;
        auVar61 = vfmadd231ps_avx512f(auVar61,auVar2,auVar17);
        uVar1 = *(undefined4 *)
                 ((long)&((Allocator *)(local_d8._0_8_ + 0x10))->_vptr_Allocator +
                 lVar44 + lVar36 + 4);
        auVar18._4_4_ = uVar1;
        auVar18._0_4_ = uVar1;
        auVar18._8_4_ = uVar1;
        auVar18._12_4_ = uVar1;
        auVar18._16_4_ = uVar1;
        auVar18._20_4_ = uVar1;
        auVar18._24_4_ = uVar1;
        auVar18._28_4_ = uVar1;
        auVar18._32_4_ = uVar1;
        auVar18._36_4_ = uVar1;
        auVar18._40_4_ = uVar1;
        auVar18._44_4_ = uVar1;
        auVar18._48_4_ = uVar1;
        auVar18._52_4_ = uVar1;
        auVar18._56_4_ = uVar1;
        auVar18._60_4_ = uVar1;
        auVar62 = vfmadd231ps_avx512f(auVar62,auVar2,auVar18);
        uVar1 = *(undefined4 *)
                 ((long)&((Allocator *)(local_d8._0_8_ + 0x18))->_vptr_Allocator + lVar44 + lVar36);
        auVar19._4_4_ = uVar1;
        auVar19._0_4_ = uVar1;
        auVar19._8_4_ = uVar1;
        auVar19._12_4_ = uVar1;
        auVar19._16_4_ = uVar1;
        auVar19._20_4_ = uVar1;
        auVar19._24_4_ = uVar1;
        auVar19._28_4_ = uVar1;
        auVar19._32_4_ = uVar1;
        auVar19._36_4_ = uVar1;
        auVar19._40_4_ = uVar1;
        auVar19._44_4_ = uVar1;
        auVar19._48_4_ = uVar1;
        auVar19._52_4_ = uVar1;
        auVar19._56_4_ = uVar1;
        auVar19._60_4_ = uVar1;
        auVar63 = vfmadd231ps_avx512f(auVar63,auVar2,auVar19);
        uVar1 = *(undefined4 *)
                 ((long)&((Allocator *)(local_d8._0_8_ + 0x18))->_vptr_Allocator +
                 lVar44 + lVar36 + 4);
        auVar20._4_4_ = uVar1;
        auVar20._0_4_ = uVar1;
        auVar20._8_4_ = uVar1;
        auVar20._12_4_ = uVar1;
        auVar20._16_4_ = uVar1;
        auVar20._20_4_ = uVar1;
        auVar20._24_4_ = uVar1;
        auVar20._28_4_ = uVar1;
        auVar20._32_4_ = uVar1;
        auVar20._36_4_ = uVar1;
        auVar20._40_4_ = uVar1;
        auVar20._44_4_ = uVar1;
        auVar20._48_4_ = uVar1;
        auVar20._52_4_ = uVar1;
        auVar20._56_4_ = uVar1;
        auVar20._60_4_ = uVar1;
        auVar64 = vfmadd231ps_avx512f(auVar64,auVar2,auVar20);
        uVar1 = *(undefined4 *)
                 ((long)&((Allocator *)(local_d8._0_8_ + 0x20))->_vptr_Allocator + lVar44 + lVar36);
        auVar21._4_4_ = uVar1;
        auVar21._0_4_ = uVar1;
        auVar21._8_4_ = uVar1;
        auVar21._12_4_ = uVar1;
        auVar21._16_4_ = uVar1;
        auVar21._20_4_ = uVar1;
        auVar21._24_4_ = uVar1;
        auVar21._28_4_ = uVar1;
        auVar21._32_4_ = uVar1;
        auVar21._36_4_ = uVar1;
        auVar21._40_4_ = uVar1;
        auVar21._44_4_ = uVar1;
        auVar21._48_4_ = uVar1;
        auVar21._52_4_ = uVar1;
        auVar21._56_4_ = uVar1;
        auVar21._60_4_ = uVar1;
        auVar65 = vfmadd231ps_avx512f(auVar65,auVar2,auVar21);
        uVar1 = *(undefined4 *)
                 ((long)&((Allocator *)(local_d8._0_8_ + 0x20))->_vptr_Allocator +
                 lVar44 + lVar36 + 4);
        auVar22._4_4_ = uVar1;
        auVar22._0_4_ = uVar1;
        auVar22._8_4_ = uVar1;
        auVar22._12_4_ = uVar1;
        auVar22._16_4_ = uVar1;
        auVar22._20_4_ = uVar1;
        auVar22._24_4_ = uVar1;
        auVar22._28_4_ = uVar1;
        auVar22._32_4_ = uVar1;
        auVar22._36_4_ = uVar1;
        auVar22._40_4_ = uVar1;
        auVar22._44_4_ = uVar1;
        auVar22._48_4_ = uVar1;
        auVar22._52_4_ = uVar1;
        auVar22._56_4_ = uVar1;
        auVar22._60_4_ = uVar1;
        auVar66 = vfmadd231ps_avx512f(auVar66,auVar2,auVar22);
        uVar1 = *(undefined4 *)
                 ((long)&((Allocator *)(local_d8._0_8_ + 0x28))->_vptr_Allocator + lVar44 + lVar36);
        auVar23._4_4_ = uVar1;
        auVar23._0_4_ = uVar1;
        auVar23._8_4_ = uVar1;
        auVar23._12_4_ = uVar1;
        auVar23._16_4_ = uVar1;
        auVar23._20_4_ = uVar1;
        auVar23._24_4_ = uVar1;
        auVar23._28_4_ = uVar1;
        auVar23._32_4_ = uVar1;
        auVar23._36_4_ = uVar1;
        auVar23._40_4_ = uVar1;
        auVar23._44_4_ = uVar1;
        auVar23._48_4_ = uVar1;
        auVar23._52_4_ = uVar1;
        auVar23._56_4_ = uVar1;
        auVar23._60_4_ = uVar1;
        auVar67 = vfmadd231ps_avx512f(auVar67,auVar2,auVar23);
        uVar1 = *(undefined4 *)
                 ((long)&((Allocator *)(local_d8._0_8_ + 0x28))->_vptr_Allocator +
                 lVar44 + lVar36 + 4);
        auVar24._4_4_ = uVar1;
        auVar24._0_4_ = uVar1;
        auVar24._8_4_ = uVar1;
        auVar24._12_4_ = uVar1;
        auVar24._16_4_ = uVar1;
        auVar24._20_4_ = uVar1;
        auVar24._24_4_ = uVar1;
        auVar24._28_4_ = uVar1;
        auVar24._32_4_ = uVar1;
        auVar24._36_4_ = uVar1;
        auVar24._40_4_ = uVar1;
        auVar24._44_4_ = uVar1;
        auVar24._48_4_ = uVar1;
        auVar24._52_4_ = uVar1;
        auVar24._56_4_ = uVar1;
        auVar24._60_4_ = uVar1;
        auVar68 = vfmadd231ps_avx512f(auVar68,auVar2,auVar24);
        uVar1 = *(undefined4 *)
                 ((long)&((Allocator *)(local_d8._0_8_ + 0x30))->_vptr_Allocator + lVar44 + lVar36);
        auVar25._4_4_ = uVar1;
        auVar25._0_4_ = uVar1;
        auVar25._8_4_ = uVar1;
        auVar25._12_4_ = uVar1;
        auVar25._16_4_ = uVar1;
        auVar25._20_4_ = uVar1;
        auVar25._24_4_ = uVar1;
        auVar25._28_4_ = uVar1;
        auVar25._32_4_ = uVar1;
        auVar25._36_4_ = uVar1;
        auVar25._40_4_ = uVar1;
        auVar25._44_4_ = uVar1;
        auVar25._48_4_ = uVar1;
        auVar25._52_4_ = uVar1;
        auVar25._56_4_ = uVar1;
        auVar25._60_4_ = uVar1;
        auVar69 = vfmadd231ps_avx512f(auVar69,auVar2,auVar25);
        uVar1 = *(undefined4 *)
                 ((long)&((Allocator *)(local_d8._0_8_ + 0x30))->_vptr_Allocator +
                 lVar44 + lVar36 + 4);
        auVar26._4_4_ = uVar1;
        auVar26._0_4_ = uVar1;
        auVar26._8_4_ = uVar1;
        auVar26._12_4_ = uVar1;
        auVar26._16_4_ = uVar1;
        auVar26._20_4_ = uVar1;
        auVar26._24_4_ = uVar1;
        auVar26._28_4_ = uVar1;
        auVar26._32_4_ = uVar1;
        auVar26._36_4_ = uVar1;
        auVar26._40_4_ = uVar1;
        auVar26._44_4_ = uVar1;
        auVar26._48_4_ = uVar1;
        auVar26._52_4_ = uVar1;
        auVar26._56_4_ = uVar1;
        auVar26._60_4_ = uVar1;
        auVar70 = vfmadd231ps_avx512f(auVar70,auVar2,auVar26);
        uVar1 = *(undefined4 *)
                 ((long)&((Allocator *)(local_d8._0_8_ + 0x38))->_vptr_Allocator + lVar44 + lVar36);
        auVar27._4_4_ = uVar1;
        auVar27._0_4_ = uVar1;
        auVar27._8_4_ = uVar1;
        auVar27._12_4_ = uVar1;
        auVar27._16_4_ = uVar1;
        auVar27._20_4_ = uVar1;
        auVar27._24_4_ = uVar1;
        auVar27._28_4_ = uVar1;
        auVar27._32_4_ = uVar1;
        auVar27._36_4_ = uVar1;
        auVar27._40_4_ = uVar1;
        auVar27._44_4_ = uVar1;
        auVar27._48_4_ = uVar1;
        auVar27._52_4_ = uVar1;
        auVar27._56_4_ = uVar1;
        auVar27._60_4_ = uVar1;
        auVar71 = vfmadd231ps_avx512f(auVar71,auVar2,auVar27);
        uVar1 = *(undefined4 *)
                 ((long)&((Allocator *)(local_d8._0_8_ + 0x38))->_vptr_Allocator +
                 lVar44 + lVar36 + 4);
        auVar28._4_4_ = uVar1;
        auVar28._0_4_ = uVar1;
        auVar28._8_4_ = uVar1;
        auVar28._12_4_ = uVar1;
        auVar28._16_4_ = uVar1;
        auVar28._20_4_ = uVar1;
        auVar28._24_4_ = uVar1;
        auVar28._28_4_ = uVar1;
        auVar28._32_4_ = uVar1;
        auVar28._36_4_ = uVar1;
        auVar28._40_4_ = uVar1;
        auVar28._44_4_ = uVar1;
        auVar28._48_4_ = uVar1;
        auVar28._52_4_ = uVar1;
        auVar28._56_4_ = uVar1;
        auVar28._60_4_ = uVar1;
        auVar72 = vfmadd231ps_avx512f(auVar72,auVar2,auVar28);
        lVar44 = lVar44 + 0x40;
      }
      *pauVar34 = auVar57;
      pauVar34[1] = auVar58;
      pauVar34[2] = auVar59;
      pauVar34[3] = auVar60;
      pauVar34[4] = auVar61;
      pauVar34[5] = auVar62;
      pauVar34[6] = auVar63;
      pauVar34[7] = auVar64;
      pauVar34[8] = auVar65;
      pauVar34[9] = auVar66;
      pauVar34[10] = auVar67;
      pauVar34[0xb] = auVar68;
      pauVar34[0xc] = auVar69;
      pauVar34[0xd] = auVar70;
      pauVar34[0xe] = auVar71;
      pauVar34[0xf] = auVar72;
      pauVar34 = pauVar34 + 0x10;
      uVar42 = uVar42 + 0x10;
      lVar32 = lVar32 + 1;
    }
    while (uVar39 = (uint)uVar42, (int)uVar39 < (int)uVar3) {
      pauVar41 = (undefined1 (*) [64])
                 (kernel->cstep * uVar40 * kernel->elemsize + (long)kernel->data);
      auVar58 = *pauVar37;
      for (lVar32 = 0; (int)uVar31 != (int)lVar32; lVar32 = lVar32 + 1) {
        auVar59 = vbroadcastss_avx512f
                            (ZEXT416(*(uint *)((long)(_func_int ***)local_d8._0_8_ +
                                              lVar32 * 4 +
                                              local_98 * local_d8._16_8_ *
                                              (ulong)((uVar39 & 0xf) +
                                                     ((uint)(uVar42 >> 4) & 0xfffffff)))));
        auVar58 = vfmadd231ps_avx512f(auVar58,auVar59,*pauVar41);
        pauVar41 = pauVar41 + 1;
      }
      *pauVar34 = auVar58;
      pauVar34 = pauVar34 + 1;
      uVar42 = (ulong)(uVar39 + 1);
    }
  }
  piVar29 = (int *)CONCAT44(local_d8._12_4_,local_d8._8_4_);
  if (piVar29 != (int *)0x0) {
    LOCK();
    *piVar29 = *piVar29 + -1;
    UNLOCK();
    if (*piVar29 == 0) {
      if ((Allocator *)local_d8._32_8_ == (Allocator *)0x0) {
        free((void *)local_d8._0_8_);
      }
      else {
        (*(*(_func_int ***)local_d8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack4to16_avx512(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 16u, 4, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    // permute
    Mat tmp;
    if (size >= 16)
        tmp.create(16 * maxk, inch, size / 16 + size % 16, 16u, 4, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 16u, 4, opt.workspace_allocator);
    {
        int nn_size = size >> 4;
        int remain_size_start = 0;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 16;

            float* tmpptr = tmp.channel(i / 16);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 4x16
                    __m128 _r0 = _mm_load_ps(img0);
                    __m128 _r1 = _mm_load_ps(img0 + 4);
                    __m128 _r2 = _mm_load_ps(img0 + 4 * 2);
                    __m128 _r3 = _mm_load_ps(img0 + 4 * 3);
                    __m128 _r4 = _mm_load_ps(img0 + 4 * 4);
                    __m128 _r5 = _mm_load_ps(img0 + 4 * 5);
                    __m128 _r6 = _mm_load_ps(img0 + 4 * 6);
                    __m128 _r7 = _mm_load_ps(img0 + 4 * 7);
                    __m128 _r8 = _mm_load_ps(img0 + 4 * 8);
                    __m128 _r9 = _mm_load_ps(img0 + 4 * 9);
                    __m128 _ra = _mm_load_ps(img0 + 4 * 10);
                    __m128 _rb = _mm_load_ps(img0 + 4 * 11);
                    __m128 _rc = _mm_load_ps(img0 + 4 * 12);
                    __m128 _rd = _mm_load_ps(img0 + 4 * 13);
                    __m128 _re = _mm_load_ps(img0 + 4 * 14);
                    __m128 _rf = _mm_load_ps(img0 + 4 * 15);

                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                    _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                    _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);
                    _MM_TRANSPOSE4_PS(_rc, _rd, _re, _rf);

                    _mm_store_ps(tmpptr, _r0);
                    _mm_store_ps(tmpptr + 4, _r4);
                    _mm_store_ps(tmpptr + 4 * 2, _r8);
                    _mm_store_ps(tmpptr + 4 * 3, _rc);
                    _mm_store_ps(tmpptr + 4 * 4, _r1);
                    _mm_store_ps(tmpptr + 4 * 5, _r5);
                    _mm_store_ps(tmpptr + 4 * 6, _r9);
                    _mm_store_ps(tmpptr + 4 * 7, _rd);
                    _mm_store_ps(tmpptr + 4 * 8, _r2);
                    _mm_store_ps(tmpptr + 4 * 9, _r6);
                    _mm_store_ps(tmpptr + 4 * 10, _ra);
                    _mm_store_ps(tmpptr + 4 * 11, _re);
                    _mm_store_ps(tmpptr + 4 * 12, _r3);
                    _mm_store_ps(tmpptr + 4 * 13, _r7);
                    _mm_store_ps(tmpptr + 4 * 14, _rb);
                    _mm_store_ps(tmpptr + 4 * 15, _rf);

                    img0 += size * 4;
                    tmpptr += 64;
                }
            }
        }

        remain_size_start += nn_size << 4;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 16 + i % 16);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    __m128 _val = _mm_load_ps(img0);
                    _mm_store_ps(tmpptr, _val);

                    img0 += size * 4;
                    tmpptr += 4;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float zeros[16] = {0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 16 : zeros;

        int i = 0;
        for (; i + 15 < size; i += 16)
        {
            float* tmpptr = tmp.channel(i / 16);
            const float* kptr = kernel.channel(p);

            int nn = inch * maxk * 4; // inch always > 0

            __m512 _sum0 = _mm512_loadu_ps(biasptr);
            __m512 _sum1 = _sum0;
            __m512 _sum2 = _sum0;
            __m512 _sum3 = _sum0;
            __m512 _sum4 = _sum0;
            __m512 _sum5 = _sum0;
            __m512 _sum6 = _sum0;
            __m512 _sum7 = _sum0;
            __m512 _sum8 = _sum0;
            __m512 _sum9 = _sum0;
            __m512 _suma = _sum0;
            __m512 _sumb = _sum0;
            __m512 _sumc = _sum0;
            __m512 _sumd = _sum0;
            __m512 _sume = _sum0;
            __m512 _sumf = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m512 _w0 = _mm512_load_ps(kptr);

                __m512 _val0 = _mm512_set1_ps(tmpptr[0]);
                __m512 _val1 = _mm512_set1_ps(tmpptr[1]);
                _sum0 = _mm512_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm512_fmadd_ps(_val1, _w0, _sum1);
                __m512 _val2 = _mm512_set1_ps(tmpptr[2]);
                __m512 _val3 = _mm512_set1_ps(tmpptr[3]);
                _sum2 = _mm512_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm512_fmadd_ps(_val3, _w0, _sum3);
                __m512 _val4 = _mm512_set1_ps(tmpptr[4]);
                __m512 _val5 = _mm512_set1_ps(tmpptr[5]);
                _sum4 = _mm512_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm512_fmadd_ps(_val5, _w0, _sum5);
                __m512 _val6 = _mm512_set1_ps(tmpptr[6]);
                __m512 _val7 = _mm512_set1_ps(tmpptr[7]);
                _sum6 = _mm512_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm512_fmadd_ps(_val7, _w0, _sum7);
                __m512 _val8 = _mm512_set1_ps(tmpptr[8]);
                __m512 _val9 = _mm512_set1_ps(tmpptr[9]);
                _sum8 = _mm512_fmadd_ps(_val8, _w0, _sum8);
                _sum9 = _mm512_fmadd_ps(_val9, _w0, _sum9);
                __m512 _vala = _mm512_set1_ps(tmpptr[10]);
                __m512 _valb = _mm512_set1_ps(tmpptr[11]);
                _suma = _mm512_fmadd_ps(_vala, _w0, _suma);
                _sumb = _mm512_fmadd_ps(_valb, _w0, _sumb);
                __m512 _valc = _mm512_set1_ps(tmpptr[12]);
                __m512 _vald = _mm512_set1_ps(tmpptr[13]);
                _sumc = _mm512_fmadd_ps(_valc, _w0, _sumc);
                _sumd = _mm512_fmadd_ps(_vald, _w0, _sumd);
                __m512 _vale = _mm512_set1_ps(tmpptr[14]);
                __m512 _valf = _mm512_set1_ps(tmpptr[15]);
                _sume = _mm512_fmadd_ps(_vale, _w0, _sume);
                _sumf = _mm512_fmadd_ps(_valf, _w0, _sumf);

                kptr += 16;
                tmpptr += 16;
            }

            _mm512_store_ps(outptr0, _sum0);
            _mm512_store_ps(outptr0 + 16, _sum1);
            _mm512_store_ps(outptr0 + 16 * 2, _sum2);
            _mm512_store_ps(outptr0 + 16 * 3, _sum3);
            _mm512_store_ps(outptr0 + 16 * 4, _sum4);
            _mm512_store_ps(outptr0 + 16 * 5, _sum5);
            _mm512_store_ps(outptr0 + 16 * 6, _sum6);
            _mm512_store_ps(outptr0 + 16 * 7, _sum7);
            _mm512_store_ps(outptr0 + 16 * 8, _sum8);
            _mm512_store_ps(outptr0 + 16 * 9, _sum9);
            _mm512_store_ps(outptr0 + 16 * 10, _suma);
            _mm512_store_ps(outptr0 + 16 * 11, _sumb);
            _mm512_store_ps(outptr0 + 16 * 12, _sumc);
            _mm512_store_ps(outptr0 + 16 * 13, _sumd);
            _mm512_store_ps(outptr0 + 16 * 14, _sume);
            _mm512_store_ps(outptr0 + 16 * 15, _sumf);

            outptr0 += 16 * 16;
        }
        for (; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 16 + i % 16);
            const float* kptr = kernel.channel(p);

            int nn = inch * maxk * 4; // inch always > 0

            __m512 _sum0 = _mm512_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m512 _w0 = _mm512_load_ps(kptr);
                __m512 _val0 = _mm512_set1_ps(tmpptr[0]);
                _sum0 = _mm512_fmadd_ps(_val0, _w0, _sum0);

                kptr += 16;
                tmpptr += 1;
            }

            _mm512_store_ps(outptr0, _sum0);
            outptr0 += 16;
        }
    }
}